

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QWidgetItemData>>(QDataStream *s,QList<QWidgetItemData> *c)

{
  long lVar1;
  Status SVar2;
  qint64 qVar3;
  QList<QWidgetItemData> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  StreamStateSaver stateSaver;
  value_type t;
  QWidgetItemData *in_stack_ffffffffffffff78;
  StreamStateSaver *in_stack_ffffffffffffff80;
  long local_78;
  undefined1 local_30 [24];
  qsizetype in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StreamStateSaver::StreamStateSaver
            (in_stack_ffffffffffffff80,(QDataStream *)in_stack_ffffffffffffff78);
  QList<QWidgetItemData>::clear((QList<QWidgetItemData> *)in_stack_ffffffffffffff80);
  qVar3 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffff80);
  if (qVar3 < 0) {
    QDataStream::setStatus((Status)in_RDI);
  }
  else {
    QList<QWidgetItemData>::reserve(in_RSI,in_stack_ffffffffffffffe8);
    for (local_78 = 0; local_78 < qVar3; local_78 = local_78 + 1) {
      memset(local_30,0xaa,0x28);
      QWidgetItemData::QWidgetItemData((QWidgetItemData *)0x8ae470);
      ::operator>>((QDataStream *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 == Ok) {
        QList<QWidgetItemData>::append
                  ((QList<QWidgetItemData> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else {
        QList<QWidgetItemData>::clear((QList<QWidgetItemData> *)in_stack_ffffffffffffff80);
      }
      QWidgetItemData::~QWidgetItemData((QWidgetItemData *)0x8ae4c3);
      if (SVar2 != Ok) break;
    }
  }
  StreamStateSaver::~StreamStateSaver(in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}